

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netbase_tests.cpp
# Opt level: O0

void __thiscall netbase_tests::netpermissions_test::test_method(netpermissions_test *this)

{
  long lVar1;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __last;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __last_00;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __last_01;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __last_02;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __last_03;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __last_04;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __last_05;
  bool bVar2;
  long in_FS_OFFSET;
  char *in_stack_ffffffffffffd0e8;
  NetWhitebindPermissions *in_stack_ffffffffffffd0f0;
  char *in_stack_ffffffffffffd0f8;
  size_type in_stack_ffffffffffffd108;
  undefined4 in_stack_ffffffffffffd110;
  NetPermissionFlags in_stack_ffffffffffffd114;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_ffffffffffffd118;
  const_string *in_stack_ffffffffffffd120;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_ffffffffffffd128;
  bilingual_str *in_stack_ffffffffffffd130;
  undefined7 in_stack_ffffffffffffd138;
  undefined1 in_stack_ffffffffffffd13f;
  NetWhitelistPermissions *in_stack_ffffffffffffd140;
  string *in_stack_ffffffffffffd148;
  netpermissions_test *this_local;
  const_string local_24d8 [2];
  lazy_ostream local_24b8 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2498;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2490;
  assertion_result local_2488 [2];
  const_string local_2450 [2];
  lazy_ostream local_2430 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2410;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2408;
  assertion_result local_2400 [2];
  const_string local_23c8 [2];
  lazy_ostream local_23a8 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2388;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2380;
  assertion_result local_2378 [2];
  const_string local_2340 [2];
  lazy_ostream local_2320 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2300;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_22f8;
  assertion_result local_22f0 [2];
  const_string local_22b8 [2];
  lazy_ostream local_2298 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2270;
  assertion_result local_2268 [2];
  const_string local_2230 [2];
  lazy_ostream local_2210 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_21f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_21e8;
  assertion_result local_21e0 [2];
  const_string local_21a8 [2];
  lazy_ostream local_2188 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2160;
  assertion_result local_2158 [2];
  NetWhitebindPermissions local_211c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  strings;
  NetWhitebindPermissions local_20a4;
  const_string local_2050 [2];
  lazy_ostream local_2030 [2];
  allocator<char> local_2009;
  assertion_result local_2008 [2];
  NetWhitebindPermissions local_1fcc;
  const_string local_1f78 [2];
  lazy_ostream local_1f58 [2];
  allocator<char> local_1f31;
  assertion_result local_1f30 [2];
  NetWhitebindPermissions local_1ef4;
  const_string local_1ea0 [2];
  lazy_ostream local_1e80 [2];
  allocator<char> local_1e59;
  assertion_result local_1e58 [2];
  const_string local_1e20 [2];
  lazy_ostream local_1e00 [2];
  allocator<char> local_1dd9;
  assertion_result local_1dd8 [2];
  undefined1 local_1da0 [16];
  undefined1 local_1d90 [64];
  const_string local_1d50 [2];
  lazy_ostream local_1d30 [2];
  assertion_result local_1d10 [2];
  NetWhitebindPermissions local_1cd4;
  const_string local_1c80 [2];
  lazy_ostream local_1c60 [2];
  allocator<char> local_1c39;
  assertion_result local_1c38 [2];
  const_string local_1c00 [2];
  lazy_ostream local_1be0 [2];
  assertion_result local_1bc0 [2];
  NetWhitebindPermissions local_1b84;
  const_string local_1b30 [2];
  lazy_ostream local_1b10 [2];
  allocator<char> local_1ae9;
  assertion_result local_1ae8 [2];
  const_string local_1ab0 [2];
  lazy_ostream local_1a90 [2];
  assertion_result local_1a70 [2];
  const_string local_1a38 [2];
  lazy_ostream local_1a18 [2];
  allocator<char> local_19f1;
  assertion_result local_19f0 [2];
  const_string local_19b8 [2];
  lazy_ostream local_1998 [2];
  assertion_result local_1978 [2];
  const_string local_1940 [2];
  lazy_ostream local_1920 [2];
  allocator<char> local_18f9;
  assertion_result local_18f8 [2];
  const_string local_18c0 [2];
  lazy_ostream local_18a0 [2];
  assertion_result local_1880 [2];
  const_string local_1848 [2];
  lazy_ostream local_1828 [2];
  allocator<char> local_1801;
  assertion_result local_1800 [2];
  NetWhitebindPermissions local_17c4;
  const_string local_1770 [2];
  lazy_ostream local_1750 [2];
  allocator<char> local_1729;
  assertion_result local_1728 [2];
  NetWhitebindPermissions local_16ec;
  const_string local_1698 [2];
  lazy_ostream local_1678 [2];
  allocator<char> local_1651;
  assertion_result local_1650 [2];
  NetWhitebindPermissions local_1614;
  const_string local_15c0 [2];
  lazy_ostream local_15a0 [2];
  allocator<char> local_1579;
  assertion_result local_1578 [2];
  NetWhitebindPermissions local_153c;
  const_string local_14e8 [2];
  lazy_ostream local_14c8 [2];
  allocator<char> local_14a1;
  assertion_result local_14a0 [2];
  NetWhitebindPermissions local_1464;
  const_string local_1410 [2];
  lazy_ostream local_13f0 [2];
  allocator<char> local_13c9;
  assertion_result local_13c8 [2];
  const_string local_1390 [2];
  lazy_ostream local_1370 [2];
  allocator<char> local_1349;
  assertion_result local_1348 [2];
  NetWhitebindPermissions local_130c;
  const_string local_12b8 [2];
  lazy_ostream local_1298 [2];
  allocator<char> local_1271;
  assertion_result local_1270 [2];
  NetWhitebindPermissions local_1234;
  const_string local_11e0 [2];
  lazy_ostream local_11c0 [2];
  allocator<char> local_1199;
  assertion_result local_1198 [2];
  const_string local_1160 [2];
  lazy_ostream local_1140 [2];
  assertion_result local_1120 [2];
  const_string local_10e8 [2];
  lazy_ostream local_10c8 [2];
  assertion_result local_10a8 [2];
  NetWhitebindPermissions local_106c;
  const_string local_1018;
  undefined8 local_1000;
  lazy_ostream local_ff8 [2];
  allocator<char> local_fd1;
  assertion_result local_fd0 [2];
  undefined1 local_f98 [16];
  undefined1 local_f88 [64];
  const_string local_f48 [2];
  lazy_ostream local_f28 [2];
  allocator<char> local_f01;
  assertion_result local_f00 [2];
  undefined1 local_ec8 [16];
  undefined1 local_eb8 [64];
  const_string local_e78 [2];
  lazy_ostream local_e58 [2];
  allocator<char> local_e31;
  assertion_result local_e30 [2];
  const_string local_df8 [2];
  lazy_ostream local_dd8 [2];
  assertion_result local_db8 [2];
  const_string local_d80 [2];
  lazy_ostream local_d60 [2];
  assertion_result local_d40 [2];
  NetWhitebindPermissions local_d04;
  const_string local_cb0 [2];
  lazy_ostream local_c90 [2];
  allocator<char> local_c69;
  assertion_result local_c68 [2];
  NetWhitebindPermissions local_c2c;
  const_string local_bd8 [2];
  lazy_ostream local_bb8 [2];
  allocator<char> local_b91;
  assertion_result local_b90 [2];
  NetWhitebindPermissions local_b54;
  const_string local_b00 [2];
  lazy_ostream local_ae0 [2];
  allocator<char> local_ab9;
  assertion_result local_ab8 [2];
  const_string local_a80 [2];
  lazy_ostream local_a60 [2];
  assertion_result local_a40 [2];
  NetWhitebindPermissions local_a04;
  const_string local_9b0 [2];
  lazy_ostream local_990 [2];
  assertion_result local_970 [2];
  const_string local_938 [2];
  lazy_ostream local_918 [2];
  assertion_result local_8f8 [2];
  NetWhitebindPermissions local_8bc;
  const_string local_868 [2];
  lazy_ostream local_848 [2];
  assertion_result local_828 [2];
  const_string local_7f0 [2];
  lazy_ostream local_7d0 [2];
  allocator<char> local_7a9;
  assertion_result local_7a8 [2];
  const_string local_770 [2];
  lazy_ostream local_750 [2];
  allocator<char> local_729;
  assertion_result local_728 [2];
  const_string local_6f0 [2];
  lazy_ostream local_6d0 [2];
  assertion_result local_6b0 [2];
  const_string local_678 [2];
  lazy_ostream local_658 [2];
  allocator<char> local_631;
  assertion_result local_630 [2];
  const_string local_5f8 [2];
  lazy_ostream local_5d8 [2];
  assertion_result local_5b8 [2];
  const_string local_580 [2];
  lazy_ostream local_560 [2];
  allocator<char> local_539;
  assertion_result local_538 [2];
  ConnectionDirection connection_direction;
  undefined1 local_478 [576];
  NetWhitebindPermissions download;
  NetWhitebindPermissions download_noban;
  NetWhitebindPermissions noban_download;
  NetWhitebindPermissions noban;
  NetWhitelistPermissions whitelistPermissions;
  NetWhitebindPermissions whitebindPermissions;
  bilingual_str error;
  
  local_1000 = 0;
  local_2008[0].m_message.px = (element_type *)0x0;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bilingual_str::bilingual_str((bilingual_str *)in_stack_ffffffffffffd0e8);
  NetWhitebindPermissions::NetWhitebindPermissions
            ((NetWhitebindPermissions *)in_stack_ffffffffffffd0e8);
  NetWhitelistPermissions::NetWhitelistPermissions
            ((NetWhitelistPermissions *)in_stack_ffffffffffffd0e8);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd128._M_current,in_stack_ffffffffffffd120,
               (size_t)in_stack_ffffffffffffd118._M_current,
               (const_string *)CONCAT44(in_stack_ffffffffffffd114,in_stack_ffffffffffffd110));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffd13f,in_stack_ffffffffffffd138),
               (char *)in_stack_ffffffffffffd130,
               (allocator<char> *)in_stack_ffffffffffffd128._M_current);
    NetWhitebindPermissions::TryParse
              ((string *)in_stack_ffffffffffffd140,
               (NetWhitebindPermissions *)
               CONCAT17(in_stack_ffffffffffffd13f,in_stack_ffffffffffffd138),
               in_stack_ffffffffffffd130);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd0f8,
               SUB81((ulong)in_stack_ffffffffffffd0f0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd0f0,
               (basic_cstring<const_char> *)in_stack_ffffffffffffd0e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    in_stack_ffffffffffffd0e8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_538,local_560,local_580,0x174,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd0e8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd0e8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd0e8);
    std::allocator<char>::~allocator(&local_539);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd128._M_current,in_stack_ffffffffffffd120,
               (size_t)in_stack_ffffffffffffd118._M_current,
               (const_string *)CONCAT44(in_stack_ffffffffffffd114,in_stack_ffffffffffffd110));
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
              (in_stack_ffffffffffffd118._M_current,
               (char *)CONCAT44(in_stack_ffffffffffffd114,in_stack_ffffffffffffd110),
               in_stack_ffffffffffffd108);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd0f8,
               SUB81((ulong)in_stack_ffffffffffffd0f0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd0f0,
               (basic_cstring<const_char> *)in_stack_ffffffffffffd0e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    in_stack_ffffffffffffd0e8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_5b8,local_5d8,local_5f8,0x175,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd0e8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd0e8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd128._M_current,in_stack_ffffffffffffd120,
               (size_t)in_stack_ffffffffffffd118._M_current,
               (const_string *)CONCAT44(in_stack_ffffffffffffd114,in_stack_ffffffffffffd110));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffd13f,in_stack_ffffffffffffd138),
               (char *)in_stack_ffffffffffffd130,
               (allocator<char> *)in_stack_ffffffffffffd128._M_current);
    NetWhitebindPermissions::TryParse
              ((string *)in_stack_ffffffffffffd140,
               (NetWhitebindPermissions *)
               CONCAT17(in_stack_ffffffffffffd13f,in_stack_ffffffffffffd138),
               in_stack_ffffffffffffd130);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd0f8,
               SUB81((ulong)in_stack_ffffffffffffd0f0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd0f0,
               (basic_cstring<const_char> *)in_stack_ffffffffffffd0e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    in_stack_ffffffffffffd0e8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_630,local_658,local_678,0x176,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd0e8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd0e8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd0e8);
    std::allocator<char>::~allocator(&local_631);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd128._M_current,in_stack_ffffffffffffd120,
               (size_t)in_stack_ffffffffffffd118._M_current,
               (const_string *)CONCAT44(in_stack_ffffffffffffd114,in_stack_ffffffffffffd110));
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
              (in_stack_ffffffffffffd118._M_current,
               (char *)CONCAT44(in_stack_ffffffffffffd114,in_stack_ffffffffffffd110),
               in_stack_ffffffffffffd108);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd0f8,
               SUB81((ulong)in_stack_ffffffffffffd0f0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd0f0,
               (basic_cstring<const_char> *)in_stack_ffffffffffffd0e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    in_stack_ffffffffffffd0e8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_6b0,local_6d0,local_6f0,0x177,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd0e8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd0e8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd128._M_current,in_stack_ffffffffffffd120,
               (size_t)in_stack_ffffffffffffd118._M_current,
               (const_string *)CONCAT44(in_stack_ffffffffffffd114,in_stack_ffffffffffffd110));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffd13f,in_stack_ffffffffffffd138),
               (char *)in_stack_ffffffffffffd130,
               (allocator<char> *)in_stack_ffffffffffffd128._M_current);
    NetWhitebindPermissions::TryParse
              ((string *)in_stack_ffffffffffffd140,
               (NetWhitebindPermissions *)
               CONCAT17(in_stack_ffffffffffffd13f,in_stack_ffffffffffffd138),
               in_stack_ffffffffffffd130);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd0f8,
               SUB81((ulong)in_stack_ffffffffffffd0f0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd0f0,
               (basic_cstring<const_char> *)in_stack_ffffffffffffd0e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    in_stack_ffffffffffffd0e8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_728,local_750,local_770,0x178,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd0e8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd0e8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd0e8);
    std::allocator<char>::~allocator(&local_729);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd128._M_current,in_stack_ffffffffffffd120,
               (size_t)in_stack_ffffffffffffd118._M_current,
               (const_string *)CONCAT44(in_stack_ffffffffffffd114,in_stack_ffffffffffffd110));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffd13f,in_stack_ffffffffffffd138),
               (char *)in_stack_ffffffffffffd130,
               (allocator<char> *)in_stack_ffffffffffffd128._M_current);
    NetWhitebindPermissions::TryParse
              ((string *)in_stack_ffffffffffffd140,
               (NetWhitebindPermissions *)
               CONCAT17(in_stack_ffffffffffffd13f,in_stack_ffffffffffffd138),
               in_stack_ffffffffffffd130);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd0f8,
               SUB81((ulong)in_stack_ffffffffffffd0f0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd0f0,
               (basic_cstring<const_char> *)in_stack_ffffffffffffd0e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    in_stack_ffffffffffffd0e8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_7a8,local_7d0,local_7f0,0x17b,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd0e8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd0e8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd0e8);
    std::allocator<char>::~allocator(&local_7a9);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd128._M_current,in_stack_ffffffffffffd120,
               (size_t)in_stack_ffffffffffffd118._M_current,
               (const_string *)CONCAT44(in_stack_ffffffffffffd114,in_stack_ffffffffffffd110));
    bilingual_str::empty((bilingual_str *)in_stack_ffffffffffffd0e8);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd0f8,
               SUB81((ulong)in_stack_ffffffffffffd0f0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd0f0,
               (basic_cstring<const_char> *)in_stack_ffffffffffffd0e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    in_stack_ffffffffffffd0e8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_828,local_848,local_868,0x17c,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd0e8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd0e8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd128._M_current,in_stack_ffffffffffffd120,
               (size_t)in_stack_ffffffffffffd118._M_current,
               (const_string *)CONCAT44(in_stack_ffffffffffffd114,in_stack_ffffffffffffd110));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd0f0,(char (*) [1])in_stack_ffffffffffffd0e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    local_8bc.super_NetPermissions.m_flags = Implicit;
    in_stack_ffffffffffffd0f8 = "NetPermissionFlags::Implicit";
    in_stack_ffffffffffffd0f0 = &local_8bc;
    in_stack_ffffffffffffd0e8 = "whitebindPermissions.m_flags";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,NetPermissionFlags,NetPermissionFlags>
              ((undefined1 *)((long)&local_8bc.m_service.super_CNetAddr.m_addr._union + 0xc),
               &local_8bc.field_0x4,0x17d,1,2,&whitebindPermissions);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd0e8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd128._M_current,in_stack_ffffffffffffd120,
               (size_t)in_stack_ffffffffffffd118._M_current,
               (const_string *)CONCAT44(in_stack_ffffffffffffd114,in_stack_ffffffffffffd110));
    NetPermissions::HasFlag
              ((NetPermissionFlags)((ulong)in_stack_ffffffffffffd0e8 >> 0x20),
               (NetPermissionFlags)in_stack_ffffffffffffd0e8);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd0f8,
               SUB81((ulong)in_stack_ffffffffffffd0f0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd0f0,
               (basic_cstring<const_char> *)in_stack_ffffffffffffd0e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    in_stack_ffffffffffffd0e8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_8f8,local_918,local_938,0x17e,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd0e8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd0e8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  NetPermissions::ClearFlag((NetPermissionFlags *)in_stack_ffffffffffffd0e8,None);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd128._M_current,in_stack_ffffffffffffd120,
               (size_t)in_stack_ffffffffffffd118._M_current,
               (const_string *)CONCAT44(in_stack_ffffffffffffd114,in_stack_ffffffffffffd110));
    NetPermissions::HasFlag
              ((NetPermissionFlags)((ulong)in_stack_ffffffffffffd0e8 >> 0x20),
               (NetPermissionFlags)in_stack_ffffffffffffd0e8);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd0f8,
               SUB81((ulong)in_stack_ffffffffffffd0f0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd0f0,
               (basic_cstring<const_char> *)in_stack_ffffffffffffd0e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    in_stack_ffffffffffffd0e8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_970,local_990,local_9b0,0x180,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd0e8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd0e8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd128._M_current,in_stack_ffffffffffffd120,
               (size_t)in_stack_ffffffffffffd118._M_current,
               (const_string *)CONCAT44(in_stack_ffffffffffffd114,in_stack_ffffffffffffd110));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd0f0,(char (*) [1])in_stack_ffffffffffffd0e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    local_a04.super_NetPermissions.m_flags = None;
    in_stack_ffffffffffffd0f8 = "NetPermissionFlags::None";
    in_stack_ffffffffffffd0f0 = &local_a04;
    in_stack_ffffffffffffd0e8 = "whitebindPermissions.m_flags";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,NetPermissionFlags,NetPermissionFlags>
              ((undefined1 *)((long)&local_a04.m_service.super_CNetAddr.m_addr._union + 0xc),
               &local_a04.field_0x4,0x181,1,2,&whitebindPermissions);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd0e8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  NetPermissions::AddFlag((NetPermissionFlags *)in_stack_ffffffffffffd0e8,None);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd128._M_current,in_stack_ffffffffffffd120,
               (size_t)in_stack_ffffffffffffd118._M_current,
               (const_string *)CONCAT44(in_stack_ffffffffffffd114,in_stack_ffffffffffffd110));
    NetPermissions::HasFlag
              ((NetPermissionFlags)((ulong)in_stack_ffffffffffffd0e8 >> 0x20),
               (NetPermissionFlags)in_stack_ffffffffffffd0e8);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd0f8,
               SUB81((ulong)in_stack_ffffffffffffd0f0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd0f0,
               (basic_cstring<const_char> *)in_stack_ffffffffffffd0e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    in_stack_ffffffffffffd0e8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_a40,local_a60,local_a80,0x183,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd0e8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd0e8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd128._M_current,in_stack_ffffffffffffd120,
               (size_t)in_stack_ffffffffffffd118._M_current,
               (const_string *)CONCAT44(in_stack_ffffffffffffd114,in_stack_ffffffffffffd110));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffd13f,in_stack_ffffffffffffd138),
               (char *)in_stack_ffffffffffffd130,
               (allocator<char> *)in_stack_ffffffffffffd128._M_current);
    NetWhitebindPermissions::TryParse
              ((string *)in_stack_ffffffffffffd140,
               (NetWhitebindPermissions *)
               CONCAT17(in_stack_ffffffffffffd13f,in_stack_ffffffffffffd138),
               in_stack_ffffffffffffd130);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd0f8,
               SUB81((ulong)in_stack_ffffffffffffd0f0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd0f0,
               (basic_cstring<const_char> *)in_stack_ffffffffffffd0e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    in_stack_ffffffffffffd0e8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_ab8,local_ae0,local_b00,0x186,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd0e8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd0e8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd0e8);
    std::allocator<char>::~allocator(&local_ab9);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd128._M_current,in_stack_ffffffffffffd120,
               (size_t)in_stack_ffffffffffffd118._M_current,
               (const_string *)CONCAT44(in_stack_ffffffffffffd114,in_stack_ffffffffffffd110));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd0f0,(char (*) [1])in_stack_ffffffffffffd0e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    local_b54.super_NetPermissions.m_flags = BloomFilter;
    in_stack_ffffffffffffd0f8 = "NetPermissionFlags::BloomFilter";
    in_stack_ffffffffffffd0f0 = &local_b54;
    in_stack_ffffffffffffd0e8 = "whitebindPermissions.m_flags";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,NetPermissionFlags,NetPermissionFlags>
              ((undefined1 *)((long)&local_b54.m_service.super_CNetAddr.m_addr._union + 0xc),
               &local_b54.field_0x4,0x187,1,2,&whitebindPermissions);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd0e8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd128._M_current,in_stack_ffffffffffffd120,
               (size_t)in_stack_ffffffffffffd118._M_current,
               (const_string *)CONCAT44(in_stack_ffffffffffffd114,in_stack_ffffffffffffd110));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffd13f,in_stack_ffffffffffffd138),
               (char *)in_stack_ffffffffffffd130,
               (allocator<char> *)in_stack_ffffffffffffd128._M_current);
    NetWhitebindPermissions::TryParse
              ((string *)in_stack_ffffffffffffd140,
               (NetWhitebindPermissions *)
               CONCAT17(in_stack_ffffffffffffd13f,in_stack_ffffffffffffd138),
               in_stack_ffffffffffffd130);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd0f8,
               SUB81((ulong)in_stack_ffffffffffffd0f0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd0f0,
               (basic_cstring<const_char> *)in_stack_ffffffffffffd0e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    in_stack_ffffffffffffd0e8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_b90,local_bb8,local_bd8,0x188,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd0e8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd0e8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd0e8);
    std::allocator<char>::~allocator(&local_b91);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd128._M_current,in_stack_ffffffffffffd120,
               (size_t)in_stack_ffffffffffffd118._M_current,
               (const_string *)CONCAT44(in_stack_ffffffffffffd114,in_stack_ffffffffffffd110));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd0f0,(char (*) [1])in_stack_ffffffffffffd0e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    local_c2c.super_NetPermissions.m_flags = None;
    in_stack_ffffffffffffd0f8 = "NetPermissionFlags::None";
    in_stack_ffffffffffffd0f0 = &local_c2c;
    in_stack_ffffffffffffd0e8 = "whitebindPermissions.m_flags";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,NetPermissionFlags,NetPermissionFlags>
              ((undefined1 *)((long)&local_c2c.m_service.super_CNetAddr.m_addr._union + 0xc),
               &local_c2c.field_0x4,0x189,1,2,&whitebindPermissions);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd0e8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  NetWhitebindPermissions::NetWhitebindPermissions
            ((NetWhitebindPermissions *)in_stack_ffffffffffffd0e8);
  NetWhitebindPermissions::NetWhitebindPermissions
            ((NetWhitebindPermissions *)in_stack_ffffffffffffd0e8);
  NetWhitebindPermissions::NetWhitebindPermissions
            ((NetWhitebindPermissions *)in_stack_ffffffffffffd0e8);
  NetWhitebindPermissions::NetWhitebindPermissions
            ((NetWhitebindPermissions *)in_stack_ffffffffffffd0e8);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd128._M_current,in_stack_ffffffffffffd120,
               (size_t)in_stack_ffffffffffffd118._M_current,
               (const_string *)CONCAT44(in_stack_ffffffffffffd114,in_stack_ffffffffffffd110));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffd13f,in_stack_ffffffffffffd138),
               (char *)in_stack_ffffffffffffd130,
               (allocator<char> *)in_stack_ffffffffffffd128._M_current);
    NetWhitebindPermissions::TryParse
              ((string *)in_stack_ffffffffffffd140,
               (NetWhitebindPermissions *)
               CONCAT17(in_stack_ffffffffffffd13f,in_stack_ffffffffffffd138),
               in_stack_ffffffffffffd130);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd0f8,
               SUB81((ulong)in_stack_ffffffffffffd0f0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd0f0,
               (basic_cstring<const_char> *)in_stack_ffffffffffffd0e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    in_stack_ffffffffffffd0e8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_c68,local_c90,local_cb0,0x18e,REQUIRE,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd0e8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd0e8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd0e8);
    std::allocator<char>::~allocator(&local_c69);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd128._M_current,in_stack_ffffffffffffd120,
               (size_t)in_stack_ffffffffffffd118._M_current,
               (const_string *)CONCAT44(in_stack_ffffffffffffd114,in_stack_ffffffffffffd110));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd0f0,(char (*) [1])in_stack_ffffffffffffd0e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    local_d04.super_NetPermissions.m_flags = NoBan;
    in_stack_ffffffffffffd0f8 = "NetPermissionFlags::NoBan";
    in_stack_ffffffffffffd0f0 = &local_d04;
    in_stack_ffffffffffffd0e8 = "noban.m_flags";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,NetPermissionFlags,NetPermissionFlags>
              ((undefined1 *)((long)&local_d04.m_service.super_CNetAddr.m_addr._union + 0xc),
               &local_d04.field_0x4,399,1,2,&noban);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd0e8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd128._M_current,in_stack_ffffffffffffd120,
               (size_t)in_stack_ffffffffffffd118._M_current,
               (const_string *)CONCAT44(in_stack_ffffffffffffd114,in_stack_ffffffffffffd110));
    NetPermissions::HasFlag
              ((NetPermissionFlags)((ulong)in_stack_ffffffffffffd0e8 >> 0x20),
               (NetPermissionFlags)in_stack_ffffffffffffd0e8);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd0f8,
               SUB81((ulong)in_stack_ffffffffffffd0f0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd0f0,
               (basic_cstring<const_char> *)in_stack_ffffffffffffd0e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    in_stack_ffffffffffffd0e8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_d40,local_d60,local_d80,400,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd0e8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd0e8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd128._M_current,in_stack_ffffffffffffd120,
               (size_t)in_stack_ffffffffffffd118._M_current,
               (const_string *)CONCAT44(in_stack_ffffffffffffd114,in_stack_ffffffffffffd110));
    NetPermissions::HasFlag
              ((NetPermissionFlags)((ulong)in_stack_ffffffffffffd0e8 >> 0x20),
               (NetPermissionFlags)in_stack_ffffffffffffd0e8);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd0f8,
               SUB81((ulong)in_stack_ffffffffffffd0f0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd0f0,
               (basic_cstring<const_char> *)in_stack_ffffffffffffd0e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    in_stack_ffffffffffffd0e8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_db8,local_dd8,local_df8,0x191,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd0e8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd0e8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd128._M_current,in_stack_ffffffffffffd120,
               (size_t)in_stack_ffffffffffffd118._M_current,
               (const_string *)CONCAT44(in_stack_ffffffffffffd114,in_stack_ffffffffffffd110));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffd13f,in_stack_ffffffffffffd138),
               (char *)in_stack_ffffffffffffd130,
               (allocator<char> *)in_stack_ffffffffffffd128._M_current);
    NetWhitebindPermissions::TryParse
              ((string *)in_stack_ffffffffffffd140,
               (NetWhitebindPermissions *)
               CONCAT17(in_stack_ffffffffffffd13f,in_stack_ffffffffffffd138),
               in_stack_ffffffffffffd130);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd0f8,
               SUB81((ulong)in_stack_ffffffffffffd0f0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd0f0,
               (basic_cstring<const_char> *)in_stack_ffffffffffffd0e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    in_stack_ffffffffffffd0e8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_e30,local_e58,local_e78,0x194,REQUIRE,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd0e8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd0e8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd0e8);
    std::allocator<char>::~allocator(&local_e31);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd128._M_current,in_stack_ffffffffffffd120,
               (size_t)in_stack_ffffffffffffd118._M_current,
               (const_string *)CONCAT44(in_stack_ffffffffffffd114,in_stack_ffffffffffffd110));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd0f0,(char (*) [1])in_stack_ffffffffffffd0e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    in_stack_ffffffffffffd0f8 = "noban.m_flags";
    in_stack_ffffffffffffd0f0 = &noban;
    in_stack_ffffffffffffd0e8 = "noban_download.m_flags";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,NetPermissionFlags,NetPermissionFlags>
              (local_eb8,local_ec8,0x195,1,2,&noban_download);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd0e8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd128._M_current,in_stack_ffffffffffffd120,
               (size_t)in_stack_ffffffffffffd118._M_current,
               (const_string *)CONCAT44(in_stack_ffffffffffffd114,in_stack_ffffffffffffd110));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffd13f,in_stack_ffffffffffffd138),
               (char *)in_stack_ffffffffffffd130,
               (allocator<char> *)in_stack_ffffffffffffd128._M_current);
    NetWhitebindPermissions::TryParse
              ((string *)in_stack_ffffffffffffd140,
               (NetWhitebindPermissions *)
               CONCAT17(in_stack_ffffffffffffd13f,in_stack_ffffffffffffd138),
               in_stack_ffffffffffffd130);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd0f8,
               SUB81((ulong)in_stack_ffffffffffffd0f0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd0f0,
               (basic_cstring<const_char> *)in_stack_ffffffffffffd0e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    in_stack_ffffffffffffd0e8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_f00,local_f28,local_f48,0x198,REQUIRE,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd0e8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd0e8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd0e8);
    std::allocator<char>::~allocator(&local_f01);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd128._M_current,in_stack_ffffffffffffd120,
               (size_t)in_stack_ffffffffffffd118._M_current,
               (const_string *)CONCAT44(in_stack_ffffffffffffd114,in_stack_ffffffffffffd110));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd0f0,(char (*) [1])in_stack_ffffffffffffd0e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    in_stack_ffffffffffffd0f8 = "noban.m_flags";
    in_stack_ffffffffffffd0f0 = &noban;
    in_stack_ffffffffffffd0e8 = "download_noban.m_flags";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,NetPermissionFlags,NetPermissionFlags>
              (local_f88,local_f98,0x199,1,2,&download_noban);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd0e8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd128._M_current,in_stack_ffffffffffffd120,
               (size_t)in_stack_ffffffffffffd118._M_current,
               (const_string *)CONCAT44(in_stack_ffffffffffffd114,in_stack_ffffffffffffd110));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffd13f,in_stack_ffffffffffffd138),
               (char *)in_stack_ffffffffffffd130,
               (allocator<char> *)in_stack_ffffffffffffd128._M_current);
    NetWhitebindPermissions::TryParse
              ((string *)in_stack_ffffffffffffd140,
               (NetWhitebindPermissions *)
               CONCAT17(in_stack_ffffffffffffd13f,in_stack_ffffffffffffd138),
               in_stack_ffffffffffffd130);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd0f8,
               SUB81((ulong)in_stack_ffffffffffffd0f0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd0f0,
               (basic_cstring<const_char> *)in_stack_ffffffffffffd0e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    in_stack_ffffffffffffd0e8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_fd0,local_ff8,&local_1018,0x19c,REQUIRE,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd0e8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd0e8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd0e8);
    std::allocator<char>::~allocator(&local_fd1);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd128._M_current,in_stack_ffffffffffffd120,
               (size_t)in_stack_ffffffffffffd118._M_current,
               (const_string *)CONCAT44(in_stack_ffffffffffffd114,in_stack_ffffffffffffd110));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd0f0,(char (*) [1])in_stack_ffffffffffffd0e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    local_106c.super_NetPermissions.m_flags = Download;
    in_stack_ffffffffffffd0f8 = "NetPermissionFlags::Download";
    in_stack_ffffffffffffd0f0 = &local_106c;
    in_stack_ffffffffffffd0e8 = "download.m_flags";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,NetPermissionFlags,NetPermissionFlags>
              ((undefined1 *)((long)&local_106c.m_service.super_CNetAddr.m_addr._union + 0xc),
               &local_106c.field_0x4,0x19d,1,2,&download);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd0e8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd128._M_current,in_stack_ffffffffffffd120,
               (size_t)in_stack_ffffffffffffd118._M_current,
               (const_string *)CONCAT44(in_stack_ffffffffffffd114,in_stack_ffffffffffffd110));
    NetPermissions::HasFlag
              ((NetPermissionFlags)((ulong)in_stack_ffffffffffffd0e8 >> 0x20),
               (NetPermissionFlags)in_stack_ffffffffffffd0e8);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd0f8,
               SUB81((ulong)in_stack_ffffffffffffd0f0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd0f0,
               (basic_cstring<const_char> *)in_stack_ffffffffffffd0e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    in_stack_ffffffffffffd0e8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_10a8,local_10c8,local_10e8,0x19e,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd0e8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd0e8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd128._M_current,in_stack_ffffffffffffd120,
               (size_t)in_stack_ffffffffffffd118._M_current,
               (const_string *)CONCAT44(in_stack_ffffffffffffd114,in_stack_ffffffffffffd110));
    NetPermissions::HasFlag
              ((NetPermissionFlags)((ulong)in_stack_ffffffffffffd0e8 >> 0x20),
               (NetPermissionFlags)in_stack_ffffffffffffd0e8);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd0f8,
               SUB81((ulong)in_stack_ffffffffffffd0f0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd0f0,
               (basic_cstring<const_char> *)in_stack_ffffffffffffd0e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    in_stack_ffffffffffffd0e8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1120,local_1140,local_1160,0x19f,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd0e8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd0e8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd128._M_current,in_stack_ffffffffffffd120,
               (size_t)in_stack_ffffffffffffd118._M_current,
               (const_string *)CONCAT44(in_stack_ffffffffffffd114,in_stack_ffffffffffffd110));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffd13f,in_stack_ffffffffffffd138),
               (char *)in_stack_ffffffffffffd130,
               (allocator<char> *)in_stack_ffffffffffffd128._M_current);
    NetWhitebindPermissions::TryParse
              ((string *)in_stack_ffffffffffffd140,
               (NetWhitebindPermissions *)
               CONCAT17(in_stack_ffffffffffffd13f,in_stack_ffffffffffffd138),
               in_stack_ffffffffffffd130);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd0f8,
               SUB81((ulong)in_stack_ffffffffffffd0f0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd0f0,
               (basic_cstring<const_char> *)in_stack_ffffffffffffd0e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    in_stack_ffffffffffffd0e8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1198,local_11c0,local_11e0,0x1a2,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd0e8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd0e8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd0e8);
    std::allocator<char>::~allocator(&local_1199);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd128._M_current,in_stack_ffffffffffffd120,
               (size_t)in_stack_ffffffffffffd118._M_current,
               (const_string *)CONCAT44(in_stack_ffffffffffffd114,in_stack_ffffffffffffd110));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd0f0,(char (*) [1])in_stack_ffffffffffffd0e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    operator|((NetPermissionFlags)((ulong)in_stack_ffffffffffffd0e8 >> 0x20),
              (NetPermissionFlags)in_stack_ffffffffffffd0e8);
    local_1234.super_NetPermissions.m_flags =
         operator|((NetPermissionFlags)((ulong)in_stack_ffffffffffffd0e8 >> 0x20),
                   (NetPermissionFlags)in_stack_ffffffffffffd0e8);
    in_stack_ffffffffffffd0f8 =
         "NetPermissionFlags::BloomFilter | NetPermissionFlags::ForceRelay | NetPermissionFlags::Relay"
    ;
    in_stack_ffffffffffffd0f0 = &local_1234;
    in_stack_ffffffffffffd0e8 = "whitebindPermissions.m_flags";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,NetPermissionFlags,NetPermissionFlags>
              ((undefined1 *)((long)&local_1234.m_service.super_CNetAddr.m_addr._union + 0xc),
               &local_1234.field_0x4,0x1a4,1,2,&whitebindPermissions);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd0e8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd128._M_current,in_stack_ffffffffffffd120,
               (size_t)in_stack_ffffffffffffd118._M_current,
               (const_string *)CONCAT44(in_stack_ffffffffffffd114,in_stack_ffffffffffffd110));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffd13f,in_stack_ffffffffffffd138),
               (char *)in_stack_ffffffffffffd130,
               (allocator<char> *)in_stack_ffffffffffffd128._M_current);
    NetWhitebindPermissions::TryParse
              ((string *)in_stack_ffffffffffffd140,
               (NetWhitebindPermissions *)
               CONCAT17(in_stack_ffffffffffffd13f,in_stack_ffffffffffffd138),
               in_stack_ffffffffffffd130);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd0f8,
               SUB81((ulong)in_stack_ffffffffffffd0f0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd0f0,
               (basic_cstring<const_char> *)in_stack_ffffffffffffd0e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    in_stack_ffffffffffffd0e8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1270,local_1298,local_12b8,0x1a5,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd0e8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd0e8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd0e8);
    std::allocator<char>::~allocator(&local_1271);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd128._M_current,in_stack_ffffffffffffd120,
               (size_t)in_stack_ffffffffffffd118._M_current,
               (const_string *)CONCAT44(in_stack_ffffffffffffd114,in_stack_ffffffffffffd110));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd0f0,(char (*) [1])in_stack_ffffffffffffd0e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    operator|((NetPermissionFlags)((ulong)in_stack_ffffffffffffd0e8 >> 0x20),
              (NetPermissionFlags)in_stack_ffffffffffffd0e8);
    local_130c.super_NetPermissions.m_flags =
         operator|((NetPermissionFlags)((ulong)in_stack_ffffffffffffd0e8 >> 0x20),
                   (NetPermissionFlags)in_stack_ffffffffffffd0e8);
    in_stack_ffffffffffffd0f8 =
         "NetPermissionFlags::BloomFilter | NetPermissionFlags::Relay | NetPermissionFlags::NoBan";
    in_stack_ffffffffffffd0f0 = &local_130c;
    in_stack_ffffffffffffd0e8 = "whitebindPermissions.m_flags";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,NetPermissionFlags,NetPermissionFlags>
              ((undefined1 *)((long)&local_130c.m_service.super_CNetAddr.m_addr._union + 0xc),
               &local_130c.field_0x4,0x1a6,1,2,&whitebindPermissions);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd0e8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd128._M_current,in_stack_ffffffffffffd120,
               (size_t)in_stack_ffffffffffffd118._M_current,
               (const_string *)CONCAT44(in_stack_ffffffffffffd114,in_stack_ffffffffffffd110));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffd13f,in_stack_ffffffffffffd138),
               (char *)in_stack_ffffffffffffd130,
               (allocator<char> *)in_stack_ffffffffffffd128._M_current);
    NetWhitebindPermissions::TryParse
              ((string *)in_stack_ffffffffffffd140,
               (NetWhitebindPermissions *)
               CONCAT17(in_stack_ffffffffffffd13f,in_stack_ffffffffffffd138),
               in_stack_ffffffffffffd130);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd0f8,
               SUB81((ulong)in_stack_ffffffffffffd0f0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd0f0,
               (basic_cstring<const_char> *)in_stack_ffffffffffffd0e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    in_stack_ffffffffffffd0e8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1348,local_1370,local_1390,0x1a7,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd0e8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd0e8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd0e8);
    std::allocator<char>::~allocator(&local_1349);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd128._M_current,in_stack_ffffffffffffd120,
               (size_t)in_stack_ffffffffffffd118._M_current,
               (const_string *)CONCAT44(in_stack_ffffffffffffd114,in_stack_ffffffffffffd110));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffd13f,in_stack_ffffffffffffd138),
               (char *)in_stack_ffffffffffffd130,
               (allocator<char> *)in_stack_ffffffffffffd128._M_current);
    NetWhitebindPermissions::TryParse
              ((string *)in_stack_ffffffffffffd140,
               (NetWhitebindPermissions *)
               CONCAT17(in_stack_ffffffffffffd13f,in_stack_ffffffffffffd138),
               in_stack_ffffffffffffd130);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd0f8,
               SUB81((ulong)in_stack_ffffffffffffd0f0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd0f0,
               (basic_cstring<const_char> *)in_stack_ffffffffffffd0e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    in_stack_ffffffffffffd0e8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_13c8,local_13f0,local_1410,0x1a8,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd0e8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd0e8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd0e8);
    std::allocator<char>::~allocator(&local_13c9);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd128._M_current,in_stack_ffffffffffffd120,
               (size_t)in_stack_ffffffffffffd118._M_current,
               (const_string *)CONCAT44(in_stack_ffffffffffffd114,in_stack_ffffffffffffd110));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd0f0,(char (*) [1])in_stack_ffffffffffffd0e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    local_1464.super_NetPermissions.m_flags = All;
    in_stack_ffffffffffffd0f8 = "NetPermissionFlags::All";
    in_stack_ffffffffffffd0f0 = &local_1464;
    in_stack_ffffffffffffd0e8 = "whitebindPermissions.m_flags";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,NetPermissionFlags,NetPermissionFlags>
              ((undefined1 *)((long)&local_1464.m_service.super_CNetAddr.m_addr._union + 0xc),
               &local_1464.field_0x4,0x1a9,1,2,&whitebindPermissions);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd0e8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd128._M_current,in_stack_ffffffffffffd120,
               (size_t)in_stack_ffffffffffffd118._M_current,
               (const_string *)CONCAT44(in_stack_ffffffffffffd114,in_stack_ffffffffffffd110));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffd13f,in_stack_ffffffffffffd138),
               (char *)in_stack_ffffffffffffd130,
               (allocator<char> *)in_stack_ffffffffffffd128._M_current);
    NetWhitebindPermissions::TryParse
              ((string *)in_stack_ffffffffffffd140,
               (NetWhitebindPermissions *)
               CONCAT17(in_stack_ffffffffffffd13f,in_stack_ffffffffffffd138),
               in_stack_ffffffffffffd130);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd0f8,
               SUB81((ulong)in_stack_ffffffffffffd0f0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd0f0,
               (basic_cstring<const_char> *)in_stack_ffffffffffffd0e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    in_stack_ffffffffffffd0e8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_14a0,local_14c8,local_14e8,0x1ac,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd0e8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd0e8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd0e8);
    std::allocator<char>::~allocator(&local_14a1);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd128._M_current,in_stack_ffffffffffffd120,
               (size_t)in_stack_ffffffffffffd118._M_current,
               (const_string *)CONCAT44(in_stack_ffffffffffffd114,in_stack_ffffffffffffd110));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd0f0,(char (*) [1])in_stack_ffffffffffffd0e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    operator|((NetPermissionFlags)((ulong)in_stack_ffffffffffffd0e8 >> 0x20),
              (NetPermissionFlags)in_stack_ffffffffffffd0e8);
    operator|((NetPermissionFlags)((ulong)in_stack_ffffffffffffd0e8 >> 0x20),
              (NetPermissionFlags)in_stack_ffffffffffffd0e8);
    local_153c.super_NetPermissions.m_flags =
         operator|((NetPermissionFlags)((ulong)in_stack_ffffffffffffd0e8 >> 0x20),
                   (NetPermissionFlags)in_stack_ffffffffffffd0e8);
    in_stack_ffffffffffffd0f8 =
         "NetPermissionFlags::BloomFilter | NetPermissionFlags::Relay | NetPermissionFlags::NoBan | NetPermissionFlags::Download"
    ;
    in_stack_ffffffffffffd0f0 = &local_153c;
    in_stack_ffffffffffffd0e8 = "whitebindPermissions.m_flags";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,NetPermissionFlags,NetPermissionFlags>
              ((undefined1 *)((long)&local_153c.m_service.super_CNetAddr.m_addr._union + 0xc),
               &local_153c.field_0x4,0x1ad,1,2,&whitebindPermissions);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd0e8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd128._M_current,in_stack_ffffffffffffd120,
               (size_t)in_stack_ffffffffffffd118._M_current,
               (const_string *)CONCAT44(in_stack_ffffffffffffd114,in_stack_ffffffffffffd110));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffd13f,in_stack_ffffffffffffd138),
               (char *)in_stack_ffffffffffffd130,
               (allocator<char> *)in_stack_ffffffffffffd128._M_current);
    NetWhitebindPermissions::TryParse
              ((string *)in_stack_ffffffffffffd140,
               (NetWhitebindPermissions *)
               CONCAT17(in_stack_ffffffffffffd13f,in_stack_ffffffffffffd138),
               in_stack_ffffffffffffd130);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd0f8,
               SUB81((ulong)in_stack_ffffffffffffd0f0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd0f0,
               (basic_cstring<const_char> *)in_stack_ffffffffffffd0e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    in_stack_ffffffffffffd0e8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1578,local_15a0,local_15c0,0x1b0,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd0e8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd0e8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd0e8);
    std::allocator<char>::~allocator(&local_1579);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd128._M_current,in_stack_ffffffffffffd120,
               (size_t)in_stack_ffffffffffffd118._M_current,
               (const_string *)CONCAT44(in_stack_ffffffffffffd114,in_stack_ffffffffffffd110));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd0f0,(char (*) [1])in_stack_ffffffffffffd0e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    operator|((NetPermissionFlags)((ulong)in_stack_ffffffffffffd0e8 >> 0x20),
              (NetPermissionFlags)in_stack_ffffffffffffd0e8);
    local_1614.super_NetPermissions.m_flags =
         operator|((NetPermissionFlags)((ulong)in_stack_ffffffffffffd0e8 >> 0x20),
                   (NetPermissionFlags)in_stack_ffffffffffffd0e8);
    in_stack_ffffffffffffd0f8 =
         "NetPermissionFlags::BloomFilter | NetPermissionFlags::Relay | NetPermissionFlags::NoBan";
    in_stack_ffffffffffffd0f0 = &local_1614;
    in_stack_ffffffffffffd0e8 = "whitebindPermissions.m_flags";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,NetPermissionFlags,NetPermissionFlags>
              ((undefined1 *)((long)&local_1614.m_service.super_CNetAddr.m_addr._union + 0xc),
               &local_1614.field_0x4,0x1b1,1,2,&whitebindPermissions);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd0e8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd128._M_current,in_stack_ffffffffffffd120,
               (size_t)in_stack_ffffffffffffd118._M_current,
               (const_string *)CONCAT44(in_stack_ffffffffffffd114,in_stack_ffffffffffffd110));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffd13f,in_stack_ffffffffffffd138),
               (char *)in_stack_ffffffffffffd130,
               (allocator<char> *)in_stack_ffffffffffffd128._M_current);
    NetWhitebindPermissions::TryParse
              ((string *)in_stack_ffffffffffffd140,
               (NetWhitebindPermissions *)
               CONCAT17(in_stack_ffffffffffffd13f,in_stack_ffffffffffffd138),
               in_stack_ffffffffffffd130);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd0f8,
               SUB81((ulong)in_stack_ffffffffffffd0f0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd0f0,
               (basic_cstring<const_char> *)in_stack_ffffffffffffd0e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    in_stack_ffffffffffffd0e8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1650,local_1678,local_1698,0x1b2,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd0e8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd0e8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd0e8);
    std::allocator<char>::~allocator(&local_1651);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd128._M_current,in_stack_ffffffffffffd120,
               (size_t)in_stack_ffffffffffffd118._M_current,
               (const_string *)CONCAT44(in_stack_ffffffffffffd114,in_stack_ffffffffffffd110));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd0f0,(char (*) [1])in_stack_ffffffffffffd0e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    local_16ec.super_NetPermissions.m_flags = None;
    in_stack_ffffffffffffd0f8 = "NetPermissionFlags::None";
    in_stack_ffffffffffffd0f0 = &local_16ec;
    in_stack_ffffffffffffd0e8 = "whitebindPermissions.m_flags";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,NetPermissionFlags,NetPermissionFlags>
              ((undefined1 *)((long)&local_16ec.m_service.super_CNetAddr.m_addr._union + 0xc),
               &local_16ec.field_0x4,0x1b3,1,2,&whitebindPermissions);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd0e8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd128._M_current,in_stack_ffffffffffffd120,
               (size_t)in_stack_ffffffffffffd118._M_current,
               (const_string *)CONCAT44(in_stack_ffffffffffffd114,in_stack_ffffffffffffd110));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffd13f,in_stack_ffffffffffffd138),
               (char *)in_stack_ffffffffffffd130,
               (allocator<char> *)in_stack_ffffffffffffd128._M_current);
    NetWhitebindPermissions::TryParse
              ((string *)in_stack_ffffffffffffd140,
               (NetWhitebindPermissions *)
               CONCAT17(in_stack_ffffffffffffd13f,in_stack_ffffffffffffd138),
               in_stack_ffffffffffffd130);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd0f8,
               SUB81((ulong)in_stack_ffffffffffffd0f0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd0f0,
               (basic_cstring<const_char> *)in_stack_ffffffffffffd0e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    in_stack_ffffffffffffd0e8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1728,local_1750,local_1770,0x1b4,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd0e8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd0e8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd0e8);
    std::allocator<char>::~allocator(&local_1729);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd128._M_current,in_stack_ffffffffffffd120,
               (size_t)in_stack_ffffffffffffd118._M_current,
               (const_string *)CONCAT44(in_stack_ffffffffffffd114,in_stack_ffffffffffffd110));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd0f0,(char (*) [1])in_stack_ffffffffffffd0e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    local_17c4.super_NetPermissions.m_flags = None;
    in_stack_ffffffffffffd0f8 = "NetPermissionFlags::None";
    in_stack_ffffffffffffd0f0 = &local_17c4;
    in_stack_ffffffffffffd0e8 = "whitebindPermissions.m_flags";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,NetPermissionFlags,NetPermissionFlags>
              ((undefined1 *)((long)&local_17c4.m_service.super_CNetAddr.m_addr._union + 0xc),
               &local_17c4.field_0x4,0x1b5,1,2,&whitebindPermissions);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd0e8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd128._M_current,in_stack_ffffffffffffd120,
               (size_t)in_stack_ffffffffffffd118._M_current,
               (const_string *)CONCAT44(in_stack_ffffffffffffd114,in_stack_ffffffffffffd110));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffd13f,in_stack_ffffffffffffd138),
               (char *)in_stack_ffffffffffffd130,
               (allocator<char> *)in_stack_ffffffffffffd128._M_current);
    NetWhitebindPermissions::TryParse
              ((string *)in_stack_ffffffffffffd140,
               (NetWhitebindPermissions *)
               CONCAT17(in_stack_ffffffffffffd13f,in_stack_ffffffffffffd138),
               in_stack_ffffffffffffd130);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd0f8,
               SUB81((ulong)in_stack_ffffffffffffd0f0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd0f0,
               (basic_cstring<const_char> *)in_stack_ffffffffffffd0e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    in_stack_ffffffffffffd0e8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1800,local_1828,local_1848,0x1b7,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd0e8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd0e8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd0e8);
    std::allocator<char>::~allocator(&local_1801);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd128._M_current,in_stack_ffffffffffffd120,
               (size_t)in_stack_ffffffffffffd118._M_current,
               (const_string *)CONCAT44(in_stack_ffffffffffffd114,in_stack_ffffffffffffd110));
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
              (in_stack_ffffffffffffd118._M_current,
               (char *)CONCAT44(in_stack_ffffffffffffd114,in_stack_ffffffffffffd110),
               in_stack_ffffffffffffd108);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd0f8,
               SUB81((ulong)in_stack_ffffffffffffd0f0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd0f0,
               (basic_cstring<const_char> *)in_stack_ffffffffffffd0e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    in_stack_ffffffffffffd0e8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1880,local_18a0,local_18c0,0x1b8,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd0e8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd0e8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd128._M_current,in_stack_ffffffffffffd120,
               (size_t)in_stack_ffffffffffffd118._M_current,
               (const_string *)CONCAT44(in_stack_ffffffffffffd114,in_stack_ffffffffffffd110));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffd13f,in_stack_ffffffffffffd138),
               (char *)in_stack_ffffffffffffd130,
               (allocator<char> *)in_stack_ffffffffffffd128._M_current);
    NetWhitebindPermissions::TryParse
              ((string *)in_stack_ffffffffffffd140,
               (NetWhitebindPermissions *)
               CONCAT17(in_stack_ffffffffffffd13f,in_stack_ffffffffffffd138),
               in_stack_ffffffffffffd130);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd0f8,
               SUB81((ulong)in_stack_ffffffffffffd0f0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd0f0,
               (basic_cstring<const_char> *)in_stack_ffffffffffffd0e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    in_stack_ffffffffffffd0e8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_18f8,local_1920,local_1940,0x1bb,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd0e8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd0e8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd0e8);
    std::allocator<char>::~allocator(&local_18f9);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd128._M_current,in_stack_ffffffffffffd120,
               (size_t)in_stack_ffffffffffffd118._M_current,
               (const_string *)CONCAT44(in_stack_ffffffffffffd114,in_stack_ffffffffffffd110));
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
              (in_stack_ffffffffffffd118._M_current,
               (char *)CONCAT44(in_stack_ffffffffffffd114,in_stack_ffffffffffffd110),
               in_stack_ffffffffffffd108);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd0f8,
               SUB81((ulong)in_stack_ffffffffffffd0f0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd0f0,
               (basic_cstring<const_char> *)in_stack_ffffffffffffd0e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    in_stack_ffffffffffffd0e8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1978,local_1998,local_19b8,0x1bc,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd0e8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd0e8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd128._M_current,in_stack_ffffffffffffd120,
               (size_t)in_stack_ffffffffffffd118._M_current,
               (const_string *)CONCAT44(in_stack_ffffffffffffd114,in_stack_ffffffffffffd110));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffd13f,in_stack_ffffffffffffd138),
               (char *)in_stack_ffffffffffffd130,
               (allocator<char> *)in_stack_ffffffffffffd128._M_current);
    NetWhitelistPermissions::TryParse
              (in_stack_ffffffffffffd148,in_stack_ffffffffffffd140,
               (ConnectionDirection *)CONCAT17(in_stack_ffffffffffffd13f,in_stack_ffffffffffffd138),
               in_stack_ffffffffffffd130);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd0f8,
               SUB81((ulong)in_stack_ffffffffffffd0f0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd0f0,
               (basic_cstring<const_char> *)in_stack_ffffffffffffd0e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    in_stack_ffffffffffffd0e8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_19f0,local_1a18,local_1a38,0x1bf,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd0e8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd0e8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd0e8);
    std::allocator<char>::~allocator(&local_19f1);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd128._M_current,in_stack_ffffffffffffd120,
               (size_t)in_stack_ffffffffffffd118._M_current,
               (const_string *)CONCAT44(in_stack_ffffffffffffd114,in_stack_ffffffffffffd110));
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
              (in_stack_ffffffffffffd118._M_current,
               (char *)CONCAT44(in_stack_ffffffffffffd114,in_stack_ffffffffffffd110),
               in_stack_ffffffffffffd108);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd0f8,
               SUB81((ulong)in_stack_ffffffffffffd0f0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd0f0,
               (basic_cstring<const_char> *)in_stack_ffffffffffffd0e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    in_stack_ffffffffffffd0e8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1a70,local_1a90,local_1ab0,0x1c0,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd0e8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd0e8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd128._M_current,in_stack_ffffffffffffd120,
               (size_t)in_stack_ffffffffffffd118._M_current,
               (const_string *)CONCAT44(in_stack_ffffffffffffd114,in_stack_ffffffffffffd110));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffd13f,in_stack_ffffffffffffd138),
               (char *)in_stack_ffffffffffffd130,
               (allocator<char> *)in_stack_ffffffffffffd128._M_current);
    NetWhitelistPermissions::TryParse
              (in_stack_ffffffffffffd148,in_stack_ffffffffffffd140,
               (ConnectionDirection *)CONCAT17(in_stack_ffffffffffffd13f,in_stack_ffffffffffffd138),
               in_stack_ffffffffffffd130);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd0f8,
               SUB81((ulong)in_stack_ffffffffffffd0f0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd0f0,
               (basic_cstring<const_char> *)in_stack_ffffffffffffd0e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    in_stack_ffffffffffffd0e8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1ae8,local_1b10,local_1b30,0x1c3,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd0e8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd0e8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd0e8);
    std::allocator<char>::~allocator(&local_1ae9);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd128._M_current,in_stack_ffffffffffffd120,
               (size_t)in_stack_ffffffffffffd118._M_current,
               (const_string *)CONCAT44(in_stack_ffffffffffffd114,in_stack_ffffffffffffd110));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd0f0,(char (*) [1])in_stack_ffffffffffffd0e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    local_1b84.super_NetPermissions.m_flags = NoBan;
    in_stack_ffffffffffffd0f8 = "NetPermissionFlags::NoBan";
    in_stack_ffffffffffffd0f0 = &local_1b84;
    in_stack_ffffffffffffd0e8 = "whitelistPermissions.m_flags";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,NetPermissionFlags,NetPermissionFlags>
              ((undefined1 *)((long)&local_1b84.m_service.super_CNetAddr.m_addr._union + 0xc),
               &local_1b84.field_0x4,0x1c4,1,2,&whitelistPermissions);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd0e8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd128._M_current,in_stack_ffffffffffffd120,
               (size_t)in_stack_ffffffffffffd118._M_current,
               (const_string *)CONCAT44(in_stack_ffffffffffffd114,in_stack_ffffffffffffd110));
    NetPermissions::HasFlag
              ((NetPermissionFlags)((ulong)in_stack_ffffffffffffd0e8 >> 0x20),
               (NetPermissionFlags)in_stack_ffffffffffffd0e8);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd0f8,
               SUB81((ulong)in_stack_ffffffffffffd0f0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd0f0,
               (basic_cstring<const_char> *)in_stack_ffffffffffffd0e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    in_stack_ffffffffffffd0e8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1bc0,local_1be0,local_1c00,0x1c5,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd0e8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd0e8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd128._M_current,in_stack_ffffffffffffd120,
               (size_t)in_stack_ffffffffffffd118._M_current,
               (const_string *)CONCAT44(in_stack_ffffffffffffd114,in_stack_ffffffffffffd110));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffd13f,in_stack_ffffffffffffd138),
               (char *)in_stack_ffffffffffffd130,
               (allocator<char> *)in_stack_ffffffffffffd128._M_current);
    NetWhitelistPermissions::TryParse
              (in_stack_ffffffffffffd148,in_stack_ffffffffffffd140,
               (ConnectionDirection *)CONCAT17(in_stack_ffffffffffffd13f,in_stack_ffffffffffffd138),
               in_stack_ffffffffffffd130);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd0f8,
               SUB81((ulong)in_stack_ffffffffffffd0f0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd0f0,
               (basic_cstring<const_char> *)in_stack_ffffffffffffd0e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    in_stack_ffffffffffffd0e8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1c38,local_1c60,local_1c80,0x1c7,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd0e8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd0e8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd0e8);
    std::allocator<char>::~allocator(&local_1c39);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd128._M_current,in_stack_ffffffffffffd120,
               (size_t)in_stack_ffffffffffffd118._M_current,
               (const_string *)CONCAT44(in_stack_ffffffffffffd114,in_stack_ffffffffffffd110));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd0f0,(char (*) [1])in_stack_ffffffffffffd0e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    operator|((NetPermissionFlags)((ulong)in_stack_ffffffffffffd0e8 >> 0x20),
              (NetPermissionFlags)in_stack_ffffffffffffd0e8);
    operator|((NetPermissionFlags)((ulong)in_stack_ffffffffffffd0e8 >> 0x20),
              (NetPermissionFlags)in_stack_ffffffffffffd0e8);
    local_1cd4.super_NetPermissions.m_flags =
         operator|((NetPermissionFlags)((ulong)in_stack_ffffffffffffd0e8 >> 0x20),
                   (NetPermissionFlags)in_stack_ffffffffffffd0e8);
    in_stack_ffffffffffffd0f8 =
         "NetPermissionFlags::BloomFilter | NetPermissionFlags::ForceRelay | NetPermissionFlags::NoBan | NetPermissionFlags::Relay"
    ;
    in_stack_ffffffffffffd0f0 = &local_1cd4;
    in_stack_ffffffffffffd0e8 = "whitelistPermissions.m_flags";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,NetPermissionFlags,NetPermissionFlags>
              ((undefined1 *)((long)&local_1cd4.m_service.super_CNetAddr.m_addr._union + 0xc),
               &local_1cd4.field_0x4,0x1c8,1,2,&whitelistPermissions);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd0e8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd128._M_current,in_stack_ffffffffffffd120,
               (size_t)in_stack_ffffffffffffd118._M_current,
               (const_string *)CONCAT44(in_stack_ffffffffffffd114,in_stack_ffffffffffffd110));
    bilingual_str::empty((bilingual_str *)in_stack_ffffffffffffd0e8);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd0f8,
               SUB81((ulong)in_stack_ffffffffffffd0f0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd0f0,
               (basic_cstring<const_char> *)in_stack_ffffffffffffd0e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    in_stack_ffffffffffffd0e8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1d10,local_1d30,local_1d50,0x1c9,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd0e8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd0e8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd128._M_current,in_stack_ffffffffffffd120,
               (size_t)in_stack_ffffffffffffd118._M_current,
               (const_string *)CONCAT44(in_stack_ffffffffffffd114,in_stack_ffffffffffffd110));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd0f0,(char (*) [1])in_stack_ffffffffffffd0e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    CSubNet::ToString_abi_cxx11_
              ((CSubNet *)CONCAT17(in_stack_ffffffffffffd13f,in_stack_ffffffffffffd138));
    in_stack_ffffffffffffd0f8 = "\"1.2.3.4/32\"";
    in_stack_ffffffffffffd0f0 = (NetWhitebindPermissions *)0x1c162e0;
    in_stack_ffffffffffffd0e8 = "whitelistPermissions.m_subnet.ToString()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[11]>
              (local_1d90,local_1da0,0x1ca,1,2,local_478);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd0e8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd0e8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd128._M_current,in_stack_ffffffffffffd120,
               (size_t)in_stack_ffffffffffffd118._M_current,
               (const_string *)CONCAT44(in_stack_ffffffffffffd114,in_stack_ffffffffffffd110));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffd13f,in_stack_ffffffffffffd138),
               (char *)in_stack_ffffffffffffd130,
               (allocator<char> *)in_stack_ffffffffffffd128._M_current);
    NetWhitelistPermissions::TryParse
              (in_stack_ffffffffffffd148,in_stack_ffffffffffffd140,
               (ConnectionDirection *)CONCAT17(in_stack_ffffffffffffd13f,in_stack_ffffffffffffd138),
               in_stack_ffffffffffffd130);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd0f8,
               SUB81((ulong)in_stack_ffffffffffffd0f0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd0f0,
               (basic_cstring<const_char> *)in_stack_ffffffffffffd0e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    in_stack_ffffffffffffd0e8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1dd8,local_1e00,local_1e20,0x1cb,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd0e8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd0e8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd0e8);
    std::allocator<char>::~allocator(&local_1dd9);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd128._M_current,in_stack_ffffffffffffd120,
               (size_t)in_stack_ffffffffffffd118._M_current,
               (const_string *)CONCAT44(in_stack_ffffffffffffd114,in_stack_ffffffffffffd110));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffd13f,in_stack_ffffffffffffd138),
               (char *)in_stack_ffffffffffffd130,
               (allocator<char> *)in_stack_ffffffffffffd128._M_current);
    NetWhitelistPermissions::TryParse
              (in_stack_ffffffffffffd148,in_stack_ffffffffffffd140,
               (ConnectionDirection *)CONCAT17(in_stack_ffffffffffffd13f,in_stack_ffffffffffffd138),
               in_stack_ffffffffffffd130);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd0f8,
               SUB81((ulong)in_stack_ffffffffffffd0f0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd0f0,
               (basic_cstring<const_char> *)in_stack_ffffffffffffd0e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    in_stack_ffffffffffffd0e8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1e58,local_1e80,local_1ea0,0x1cc,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd0e8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd0e8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd0e8);
    std::allocator<char>::~allocator(&local_1e59);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd128._M_current,in_stack_ffffffffffffd120,
               (size_t)in_stack_ffffffffffffd118._M_current,
               (const_string *)CONCAT44(in_stack_ffffffffffffd114,in_stack_ffffffffffffd110));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd0f0,(char (*) [1])in_stack_ffffffffffffd0e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    local_1ef4.super_NetPermissions.m_flags = 1;
    in_stack_ffffffffffffd0f8 = "ConnectionDirection::In";
    in_stack_ffffffffffffd0f0 = &local_1ef4;
    in_stack_ffffffffffffd0e8 = "connection_direction";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,ConnectionDirection,ConnectionDirection>
              ((undefined1 *)((long)&local_1ef4.m_service.super_CNetAddr.m_addr._union + 0xc),
               &local_1ef4.field_0x4,0x1cd,1,2,&connection_direction);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd0e8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd128._M_current,in_stack_ffffffffffffd120,
               (size_t)in_stack_ffffffffffffd118._M_current,
               (const_string *)CONCAT44(in_stack_ffffffffffffd114,in_stack_ffffffffffffd110));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffd13f,in_stack_ffffffffffffd138),
               (char *)in_stack_ffffffffffffd130,
               (allocator<char> *)in_stack_ffffffffffffd128._M_current);
    NetWhitelistPermissions::TryParse
              (in_stack_ffffffffffffd148,in_stack_ffffffffffffd140,
               (ConnectionDirection *)CONCAT17(in_stack_ffffffffffffd13f,in_stack_ffffffffffffd138),
               in_stack_ffffffffffffd130);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd0f8,
               SUB81((ulong)in_stack_ffffffffffffd0f0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd0f0,
               (basic_cstring<const_char> *)in_stack_ffffffffffffd0e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    in_stack_ffffffffffffd0e8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1f30,local_1f58,local_1f78,0x1ce,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd0e8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd0e8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd0e8);
    std::allocator<char>::~allocator(&local_1f31);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd128._M_current,in_stack_ffffffffffffd120,
               (size_t)in_stack_ffffffffffffd118._M_current,
               (const_string *)CONCAT44(in_stack_ffffffffffffd114,in_stack_ffffffffffffd110));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd0f0,(char (*) [1])in_stack_ffffffffffffd0e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    local_1fcc.super_NetPermissions.m_flags = BloomFilter;
    in_stack_ffffffffffffd0f8 = "ConnectionDirection::Out";
    in_stack_ffffffffffffd0f0 = &local_1fcc;
    in_stack_ffffffffffffd0e8 = "connection_direction";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,ConnectionDirection,ConnectionDirection>
              ((undefined1 *)((long)&local_1fcc.m_service.super_CNetAddr.m_addr._union + 0xc),
               &local_1fcc.field_0x4,0x1cf,1,2,&connection_direction);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd0e8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd128._M_current,in_stack_ffffffffffffd120,
               (size_t)in_stack_ffffffffffffd118._M_current,
               (const_string *)CONCAT44(in_stack_ffffffffffffd114,in_stack_ffffffffffffd110));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffd13f,in_stack_ffffffffffffd138),
               (char *)in_stack_ffffffffffffd130,
               (allocator<char> *)in_stack_ffffffffffffd128._M_current);
    NetWhitelistPermissions::TryParse
              (in_stack_ffffffffffffd148,in_stack_ffffffffffffd140,
               (ConnectionDirection *)CONCAT17(in_stack_ffffffffffffd13f,in_stack_ffffffffffffd138),
               in_stack_ffffffffffffd130);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd0f8,
               SUB81((ulong)in_stack_ffffffffffffd0f0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd0f0,
               (basic_cstring<const_char> *)in_stack_ffffffffffffd0e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    in_stack_ffffffffffffd0e8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_2008,local_2030,local_2050,0x1d0,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd0e8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd0e8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd0e8);
    std::allocator<char>::~allocator(&local_2009);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd128._M_current,in_stack_ffffffffffffd120,
               (size_t)in_stack_ffffffffffffd118._M_current,
               (const_string *)CONCAT44(in_stack_ffffffffffffd114,in_stack_ffffffffffffd110));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd0f0,(char (*) [1])in_stack_ffffffffffffd0e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    local_20a4.super_NetPermissions.m_flags = 3;
    in_stack_ffffffffffffd0f8 = "ConnectionDirection::Both";
    in_stack_ffffffffffffd0f0 = &local_20a4;
    in_stack_ffffffffffffd0e8 = "connection_direction";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,ConnectionDirection,ConnectionDirection>
              ((undefined1 *)((long)&local_20a4.m_service.super_CNetAddr.m_addr._union + 0xc),
               &local_20a4.field_0x4,0x1d1,1,2,&connection_direction);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd0e8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  NetPermissions::ToStrings_abi_cxx11_(in_stack_ffffffffffffd114);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd128._M_current,in_stack_ffffffffffffd120,
               (size_t)in_stack_ffffffffffffd118._M_current,
               (const_string *)CONCAT44(in_stack_ffffffffffffd114,in_stack_ffffffffffffd110));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd0f0,(char (*) [1])in_stack_ffffffffffffd0e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    local_211c._4_8_ =
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_ffffffffffffd0e8);
    local_211c.super_NetPermissions.m_flags = 7;
    in_stack_ffffffffffffd0f8 = "7U";
    in_stack_ffffffffffffd0f0 = &local_211c;
    in_stack_ffffffffffffd0e8 = "strings.size()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              (&local_211c.m_service.super_CNetAddr.m_addr.field_0x14,
               (undefined1 *)((long)&local_211c.m_service.super_CNetAddr.m_addr._union + 4),0x1d4,1,
               2,&local_211c.field_0x4);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd0e8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd128._M_current,in_stack_ffffffffffffd120,
               (size_t)in_stack_ffffffffffffd118._M_current,
               (const_string *)CONCAT44(in_stack_ffffffffffffd114,in_stack_ffffffffffffd110));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_ffffffffffffd0f0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)in_stack_ffffffffffffd0f0);
    __last._M_current._4_4_ = in_stack_ffffffffffffd114;
    __last._M_current._0_4_ = in_stack_ffffffffffffd110;
    local_2160 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::
                 find<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,char[12]>
                           (in_stack_ffffffffffffd118,__last,
                            (char (*) [12])in_stack_ffffffffffffd0f0);
    local_2168 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)in_stack_ffffffffffffd0f0);
    __gnu_cxx::
    operator==<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)in_stack_ffffffffffffd0f8,
               (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)in_stack_ffffffffffffd0f0);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd0f8,
               SUB81((ulong)in_stack_ffffffffffffd0f0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd0f0,
               (basic_cstring<const_char> *)in_stack_ffffffffffffd0e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    in_stack_ffffffffffffd0e8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_2158,local_2188,local_21a8,0x1d5,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd0e8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd0e8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd128._M_current,in_stack_ffffffffffffd120,
               (size_t)in_stack_ffffffffffffd118._M_current,
               (const_string *)CONCAT44(in_stack_ffffffffffffd114,in_stack_ffffffffffffd110));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_ffffffffffffd0f0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)in_stack_ffffffffffffd0f0);
    __last_00._M_current._4_4_ = in_stack_ffffffffffffd114;
    __last_00._M_current._0_4_ = in_stack_ffffffffffffd110;
    local_21e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::
                 find<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,char[11]>
                           (in_stack_ffffffffffffd118,__last_00,
                            (char (*) [11])in_stack_ffffffffffffd0f0);
    local_21f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)in_stack_ffffffffffffd0f0);
    __gnu_cxx::
    operator==<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)in_stack_ffffffffffffd0f8,
               (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)in_stack_ffffffffffffd0f0);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd0f8,
               SUB81((ulong)in_stack_ffffffffffffd0f0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd0f0,
               (basic_cstring<const_char> *)in_stack_ffffffffffffd0e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    in_stack_ffffffffffffd0e8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_21e0,local_2210,local_2230,0x1d6,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd0e8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd0e8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd128._M_current,in_stack_ffffffffffffd120,
               (size_t)in_stack_ffffffffffffd118._M_current,
               (const_string *)CONCAT44(in_stack_ffffffffffffd114,in_stack_ffffffffffffd110));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_ffffffffffffd0f0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)in_stack_ffffffffffffd0f0);
    __last_01._M_current._4_4_ = in_stack_ffffffffffffd114;
    __last_01._M_current._0_4_ = in_stack_ffffffffffffd110;
    local_2270 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::
                 find<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,char[6]>
                           (in_stack_ffffffffffffd118,__last_01,
                            (char (*) [6])in_stack_ffffffffffffd0f0);
    local_2278 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)in_stack_ffffffffffffd0f0);
    __gnu_cxx::
    operator==<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)in_stack_ffffffffffffd0f8,
               (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)in_stack_ffffffffffffd0f0);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd0f8,
               SUB81((ulong)in_stack_ffffffffffffd0f0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd0f0,
               (basic_cstring<const_char> *)in_stack_ffffffffffffd0e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    in_stack_ffffffffffffd0e8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_2268,local_2298,local_22b8,0x1d7,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd0e8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd0e8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd128._M_current,in_stack_ffffffffffffd120,
               (size_t)in_stack_ffffffffffffd118._M_current,
               (const_string *)CONCAT44(in_stack_ffffffffffffd114,in_stack_ffffffffffffd110));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_ffffffffffffd0f0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)in_stack_ffffffffffffd0f0);
    __last_02._M_current._4_4_ = in_stack_ffffffffffffd114;
    __last_02._M_current._0_4_ = in_stack_ffffffffffffd110;
    local_22f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::
                 find<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,char[6]>
                           (in_stack_ffffffffffffd118,__last_02,
                            (char (*) [6])in_stack_ffffffffffffd0f0);
    local_2300 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)in_stack_ffffffffffffd0f0);
    __gnu_cxx::
    operator==<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)in_stack_ffffffffffffd0f8,
               (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)in_stack_ffffffffffffd0f0);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd0f8,
               SUB81((ulong)in_stack_ffffffffffffd0f0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd0f0,
               (basic_cstring<const_char> *)in_stack_ffffffffffffd0e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    in_stack_ffffffffffffd0e8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_22f0,local_2320,local_2340,0x1d8,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd0e8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd0e8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd128._M_current,in_stack_ffffffffffffd120,
               (size_t)in_stack_ffffffffffffd118._M_current,
               (const_string *)CONCAT44(in_stack_ffffffffffffd114,in_stack_ffffffffffffd110));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_ffffffffffffd0f0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)in_stack_ffffffffffffd0f0);
    __last_03._M_current._4_4_ = in_stack_ffffffffffffd114;
    __last_03._M_current._0_4_ = in_stack_ffffffffffffd110;
    local_2380 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::
                 find<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,char[8]>
                           (in_stack_ffffffffffffd118,__last_03,
                            (char (*) [8])in_stack_ffffffffffffd0f0);
    local_2388 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)in_stack_ffffffffffffd0f0);
    __gnu_cxx::
    operator==<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)in_stack_ffffffffffffd0f8,
               (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)in_stack_ffffffffffffd0f0);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd0f8,
               SUB81((ulong)in_stack_ffffffffffffd0f0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd0f0,
               (basic_cstring<const_char> *)in_stack_ffffffffffffd0e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    in_stack_ffffffffffffd0e8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_2378,local_23a8,local_23c8,0x1d9,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd0e8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd0e8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd128._M_current,in_stack_ffffffffffffd120,
               (size_t)in_stack_ffffffffffffd118._M_current,
               (const_string *)CONCAT44(in_stack_ffffffffffffd114,in_stack_ffffffffffffd110));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_ffffffffffffd0f0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)in_stack_ffffffffffffd0f0);
    __last_04._M_current._4_4_ = in_stack_ffffffffffffd114;
    __last_04._M_current._0_4_ = in_stack_ffffffffffffd110;
    local_2408 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::
                 find<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,char[9]>
                           (in_stack_ffffffffffffd118,__last_04,
                            (char (*) [9])in_stack_ffffffffffffd0f0);
    local_2410 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)in_stack_ffffffffffffd0f0);
    __gnu_cxx::
    operator==<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)in_stack_ffffffffffffd0f8,
               (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)in_stack_ffffffffffffd0f0);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd0f8,
               SUB81((ulong)in_stack_ffffffffffffd0f0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd0f0,
               (basic_cstring<const_char> *)in_stack_ffffffffffffd0e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    in_stack_ffffffffffffd0e8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_2400,local_2430,local_2450,0x1da,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd0e8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd0e8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd128._M_current,in_stack_ffffffffffffd120,
               (size_t)in_stack_ffffffffffffd118._M_current,
               (const_string *)CONCAT44(in_stack_ffffffffffffd114,in_stack_ffffffffffffd110));
    in_stack_ffffffffffffd120 = (const_string *)&strings;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_ffffffffffffd0f0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)in_stack_ffffffffffffd0f0);
    __last_05._M_current._4_4_ = in_stack_ffffffffffffd114;
    __last_05._M_current._0_4_ = in_stack_ffffffffffffd110;
    in_stack_ffffffffffffd128 =
         std::
         find<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,char[5]>
                   (in_stack_ffffffffffffd118,__last_05,(char (*) [5])in_stack_ffffffffffffd0f0);
    local_2490 = in_stack_ffffffffffffd128._M_current;
    local_2498 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)in_stack_ffffffffffffd0f0);
    __gnu_cxx::
    operator==<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)in_stack_ffffffffffffd0f8,
               (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)in_stack_ffffffffffffd0f0);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd0f8,
               SUB81((ulong)in_stack_ffffffffffffd0f0 >> 0x38,0));
    in_stack_ffffffffffffd118._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd0f0,
               (basic_cstring<const_char> *)in_stack_ffffffffffffd0e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd0f8,
               (pointer)in_stack_ffffffffffffd0f0,(unsigned_long)in_stack_ffffffffffffd0e8);
    in_stack_ffffffffffffd0e8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_2488,local_24b8,local_24d8,0x1db,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd0e8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd0e8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
    in_stack_ffffffffffffd114 = CONCAT13(bVar2,(int3)in_stack_ffffffffffffd114);
  } while (bVar2);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_ffffffffffffd0f8);
  NetWhitebindPermissions::~NetWhitebindPermissions
            ((NetWhitebindPermissions *)in_stack_ffffffffffffd0e8);
  NetWhitebindPermissions::~NetWhitebindPermissions
            ((NetWhitebindPermissions *)in_stack_ffffffffffffd0e8);
  NetWhitebindPermissions::~NetWhitebindPermissions
            ((NetWhitebindPermissions *)in_stack_ffffffffffffd0e8);
  NetWhitebindPermissions::~NetWhitebindPermissions
            ((NetWhitebindPermissions *)in_stack_ffffffffffffd0e8);
  NetWhitelistPermissions::~NetWhitelistPermissions
            ((NetWhitelistPermissions *)in_stack_ffffffffffffd0e8);
  NetWhitebindPermissions::~NetWhitebindPermissions
            ((NetWhitebindPermissions *)in_stack_ffffffffffffd0e8);
  bilingual_str::~bilingual_str((bilingual_str *)in_stack_ffffffffffffd0e8);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(netpermissions_test)
{
    bilingual_str error;
    NetWhitebindPermissions whitebindPermissions;
    NetWhitelistPermissions whitelistPermissions;
    ConnectionDirection connection_direction;

    // Detect invalid white bind
    BOOST_CHECK(!NetWhitebindPermissions::TryParse("", whitebindPermissions, error));
    BOOST_CHECK(error.original.find("Cannot resolve -whitebind address") != std::string::npos);
    BOOST_CHECK(!NetWhitebindPermissions::TryParse("127.0.0.1", whitebindPermissions, error));
    BOOST_CHECK(error.original.find("Need to specify a port with -whitebind") != std::string::npos);
    BOOST_CHECK(!NetWhitebindPermissions::TryParse("", whitebindPermissions, error));

    // If no permission flags, assume backward compatibility
    BOOST_CHECK(NetWhitebindPermissions::TryParse("1.2.3.4:32", whitebindPermissions, error));
    BOOST_CHECK(error.empty());
    BOOST_CHECK_EQUAL(whitebindPermissions.m_flags, NetPermissionFlags::Implicit);
    BOOST_CHECK(NetPermissions::HasFlag(whitebindPermissions.m_flags, NetPermissionFlags::Implicit));
    NetPermissions::ClearFlag(whitebindPermissions.m_flags, NetPermissionFlags::Implicit);
    BOOST_CHECK(!NetPermissions::HasFlag(whitebindPermissions.m_flags, NetPermissionFlags::Implicit));
    BOOST_CHECK_EQUAL(whitebindPermissions.m_flags, NetPermissionFlags::None);
    NetPermissions::AddFlag(whitebindPermissions.m_flags, NetPermissionFlags::Implicit);
    BOOST_CHECK(NetPermissions::HasFlag(whitebindPermissions.m_flags, NetPermissionFlags::Implicit));

    // Can set one permission
    BOOST_CHECK(NetWhitebindPermissions::TryParse("bloom@1.2.3.4:32", whitebindPermissions, error));
    BOOST_CHECK_EQUAL(whitebindPermissions.m_flags, NetPermissionFlags::BloomFilter);
    BOOST_CHECK(NetWhitebindPermissions::TryParse("@1.2.3.4:32", whitebindPermissions, error));
    BOOST_CHECK_EQUAL(whitebindPermissions.m_flags, NetPermissionFlags::None);

    NetWhitebindPermissions noban, noban_download, download_noban, download;

    // "noban" implies "download"
    BOOST_REQUIRE(NetWhitebindPermissions::TryParse("noban@1.2.3.4:32", noban, error));
    BOOST_CHECK_EQUAL(noban.m_flags, NetPermissionFlags::NoBan);
    BOOST_CHECK(NetPermissions::HasFlag(noban.m_flags, NetPermissionFlags::Download));
    BOOST_CHECK(NetPermissions::HasFlag(noban.m_flags, NetPermissionFlags::NoBan));

    // "noban,download" is equivalent to "noban"
    BOOST_REQUIRE(NetWhitebindPermissions::TryParse("noban,download@1.2.3.4:32", noban_download, error));
    BOOST_CHECK_EQUAL(noban_download.m_flags, noban.m_flags);

    // "download,noban" is equivalent to "noban"
    BOOST_REQUIRE(NetWhitebindPermissions::TryParse("download,noban@1.2.3.4:32", download_noban, error));
    BOOST_CHECK_EQUAL(download_noban.m_flags, noban.m_flags);

    // "download" excludes (does not imply) "noban"
    BOOST_REQUIRE(NetWhitebindPermissions::TryParse("download@1.2.3.4:32", download, error));
    BOOST_CHECK_EQUAL(download.m_flags, NetPermissionFlags::Download);
    BOOST_CHECK(NetPermissions::HasFlag(download.m_flags, NetPermissionFlags::Download));
    BOOST_CHECK(!NetPermissions::HasFlag(download.m_flags, NetPermissionFlags::NoBan));

    // Happy path, can parse flags
    BOOST_CHECK(NetWhitebindPermissions::TryParse("bloom,forcerelay@1.2.3.4:32", whitebindPermissions, error));
    // forcerelay should also activate the relay permission
    BOOST_CHECK_EQUAL(whitebindPermissions.m_flags, NetPermissionFlags::BloomFilter | NetPermissionFlags::ForceRelay | NetPermissionFlags::Relay);
    BOOST_CHECK(NetWhitebindPermissions::TryParse("bloom,relay,noban@1.2.3.4:32", whitebindPermissions, error));
    BOOST_CHECK_EQUAL(whitebindPermissions.m_flags, NetPermissionFlags::BloomFilter | NetPermissionFlags::Relay | NetPermissionFlags::NoBan);
    BOOST_CHECK(NetWhitebindPermissions::TryParse("bloom,forcerelay,noban@1.2.3.4:32", whitebindPermissions, error));
    BOOST_CHECK(NetWhitebindPermissions::TryParse("all@1.2.3.4:32", whitebindPermissions, error));
    BOOST_CHECK_EQUAL(whitebindPermissions.m_flags, NetPermissionFlags::All);

    // Allow dups
    BOOST_CHECK(NetWhitebindPermissions::TryParse("bloom,relay,noban,noban@1.2.3.4:32", whitebindPermissions, error));
    BOOST_CHECK_EQUAL(whitebindPermissions.m_flags, NetPermissionFlags::BloomFilter | NetPermissionFlags::Relay | NetPermissionFlags::NoBan | NetPermissionFlags::Download); // "noban" implies "download"

    // Allow empty
    BOOST_CHECK(NetWhitebindPermissions::TryParse("bloom,relay,,noban@1.2.3.4:32", whitebindPermissions, error));
    BOOST_CHECK_EQUAL(whitebindPermissions.m_flags, NetPermissionFlags::BloomFilter | NetPermissionFlags::Relay | NetPermissionFlags::NoBan);
    BOOST_CHECK(NetWhitebindPermissions::TryParse(",@1.2.3.4:32", whitebindPermissions, error));
    BOOST_CHECK_EQUAL(whitebindPermissions.m_flags, NetPermissionFlags::None);
    BOOST_CHECK(NetWhitebindPermissions::TryParse(",,@1.2.3.4:32", whitebindPermissions, error));
    BOOST_CHECK_EQUAL(whitebindPermissions.m_flags, NetPermissionFlags::None);

    BOOST_CHECK(!NetWhitebindPermissions::TryParse("out,forcerelay@1.2.3.4:32", whitebindPermissions, error));
    BOOST_CHECK(error.original.find("whitebind may only be used for incoming connections (\"out\" was passed)") != std::string::npos);

    // Detect invalid flag
    BOOST_CHECK(!NetWhitebindPermissions::TryParse("bloom,forcerelay,oopsie@1.2.3.4:32", whitebindPermissions, error));
    BOOST_CHECK(error.original.find("Invalid P2P permission") != std::string::npos);

    // Check netmask error
    BOOST_CHECK(!NetWhitelistPermissions::TryParse("bloom,forcerelay,noban@1.2.3.4:32", whitelistPermissions, connection_direction, error));
    BOOST_CHECK(error.original.find("Invalid netmask specified in -whitelist") != std::string::npos);

    // Happy path for whitelist parsing
    BOOST_CHECK(NetWhitelistPermissions::TryParse("noban@1.2.3.4", whitelistPermissions, connection_direction, error));
    BOOST_CHECK_EQUAL(whitelistPermissions.m_flags, NetPermissionFlags::NoBan);
    BOOST_CHECK(NetPermissions::HasFlag(whitelistPermissions.m_flags, NetPermissionFlags::NoBan));

    BOOST_CHECK(NetWhitelistPermissions::TryParse("bloom,forcerelay,noban,relay@1.2.3.4/32", whitelistPermissions, connection_direction, error));
    BOOST_CHECK_EQUAL(whitelistPermissions.m_flags, NetPermissionFlags::BloomFilter | NetPermissionFlags::ForceRelay | NetPermissionFlags::NoBan | NetPermissionFlags::Relay);
    BOOST_CHECK(error.empty());
    BOOST_CHECK_EQUAL(whitelistPermissions.m_subnet.ToString(), "1.2.3.4/32");
    BOOST_CHECK(NetWhitelistPermissions::TryParse("bloom,forcerelay,noban,relay,mempool@1.2.3.4/32", whitelistPermissions, connection_direction, error));
    BOOST_CHECK(NetWhitelistPermissions::TryParse("in,relay@1.2.3.4", whitelistPermissions, connection_direction, error));
    BOOST_CHECK_EQUAL(connection_direction, ConnectionDirection::In);
    BOOST_CHECK(NetWhitelistPermissions::TryParse("out,bloom@1.2.3.4", whitelistPermissions, connection_direction, error));
    BOOST_CHECK_EQUAL(connection_direction, ConnectionDirection::Out);
    BOOST_CHECK(NetWhitelistPermissions::TryParse("in,out,bloom@1.2.3.4", whitelistPermissions, connection_direction, error));
    BOOST_CHECK_EQUAL(connection_direction, ConnectionDirection::Both);

    const auto strings = NetPermissions::ToStrings(NetPermissionFlags::All);
    BOOST_CHECK_EQUAL(strings.size(), 7U);
    BOOST_CHECK(std::find(strings.begin(), strings.end(), "bloomfilter") != strings.end());
    BOOST_CHECK(std::find(strings.begin(), strings.end(), "forcerelay") != strings.end());
    BOOST_CHECK(std::find(strings.begin(), strings.end(), "relay") != strings.end());
    BOOST_CHECK(std::find(strings.begin(), strings.end(), "noban") != strings.end());
    BOOST_CHECK(std::find(strings.begin(), strings.end(), "mempool") != strings.end());
    BOOST_CHECK(std::find(strings.begin(), strings.end(), "download") != strings.end());
    BOOST_CHECK(std::find(strings.begin(), strings.end(), "addr") != strings.end());
}